

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O0

xmlSchemaNodeInfoPtr xmlSchemaGetFreshElemInfo(xmlSchemaValidCtxtPtr vctxt)

{
  xmlSchemaNodeInfoPtr *ppxVar1;
  int local_24;
  xmlSchemaValidCtxtPtr pxStack_20;
  int i;
  xmlSchemaNodeInfoPtr info;
  xmlSchemaValidCtxtPtr vctxt_local;
  
  pxStack_20 = (xmlSchemaValidCtxtPtr)0x0;
  if (vctxt->sizeElemInfos < vctxt->depth) {
    xmlSchemaInternalErr
              ((xmlSchemaAbstractCtxtPtr)vctxt,"xmlSchemaGetFreshElemInfo",
               "inconsistent depth encountered");
    vctxt_local = (xmlSchemaValidCtxtPtr)0x0;
  }
  else {
    if (vctxt->elemInfos == (xmlSchemaNodeInfoPtr *)0x0) {
      ppxVar1 = (xmlSchemaNodeInfoPtr *)(*xmlMalloc)(0x50);
      vctxt->elemInfos = ppxVar1;
      if (vctxt->elemInfos == (xmlSchemaNodeInfoPtr *)0x0) {
        xmlSchemaVErrMemory(vctxt,"allocating the element info array",(xmlNodePtr)0x0);
        return (xmlSchemaNodeInfoPtr)0x0;
      }
      memset(vctxt->elemInfos,0,0x50);
      vctxt->sizeElemInfos = 10;
    }
    else if (vctxt->depth < vctxt->sizeElemInfos) {
      pxStack_20 = (xmlSchemaValidCtxtPtr)vctxt->elemInfos[vctxt->depth];
    }
    else {
      local_24 = vctxt->sizeElemInfos;
      vctxt->sizeElemInfos = vctxt->sizeElemInfos << 1;
      ppxVar1 = (xmlSchemaNodeInfoPtr *)
                (*xmlRealloc)(vctxt->elemInfos,(long)vctxt->sizeElemInfos << 3);
      vctxt->elemInfos = ppxVar1;
      if (vctxt->elemInfos == (xmlSchemaNodeInfoPtr *)0x0) {
        xmlSchemaVErrMemory(vctxt,"re-allocating the element info array",(xmlNodePtr)0x0);
        return (xmlSchemaNodeInfoPtr)0x0;
      }
      for (; local_24 < vctxt->sizeElemInfos; local_24 = local_24 + 1) {
        vctxt->elemInfos[local_24] = (xmlSchemaNodeInfoPtr)0x0;
      }
    }
    if (pxStack_20 == (xmlSchemaValidCtxtPtr)0x0) {
      pxStack_20 = (xmlSchemaValidCtxtPtr)(*xmlMalloc)(0x90);
      if (pxStack_20 == (xmlSchemaValidCtxtPtr)0x0) {
        xmlSchemaVErrMemory(vctxt,"allocating an element info",(xmlNodePtr)0x0);
        return (xmlSchemaNodeInfoPtr)0x0;
      }
      vctxt->elemInfos[vctxt->depth] = (xmlSchemaNodeInfoPtr)pxStack_20;
    }
    else if (pxStack_20->warning != (xmlSchemaValidityWarningFunc)0x0) {
      xmlSchemaInternalErr
                ((xmlSchemaAbstractCtxtPtr)vctxt,"xmlSchemaGetFreshElemInfo",
                 "elem info has not been cleared");
      return (xmlSchemaNodeInfoPtr)0x0;
    }
    memset(pxStack_20,0,0x90);
    pxStack_20->type = 1;
    *(int *)&pxStack_20->user_data = vctxt->depth;
    vctxt_local = pxStack_20;
  }
  return (xmlSchemaNodeInfoPtr)vctxt_local;
}

Assistant:

static xmlSchemaNodeInfoPtr
xmlSchemaGetFreshElemInfo(xmlSchemaValidCtxtPtr vctxt)
{
    xmlSchemaNodeInfoPtr info = NULL;

    if (vctxt->depth > vctxt->sizeElemInfos) {
	VERROR_INT("xmlSchemaGetFreshElemInfo",
	    "inconsistent depth encountered");
	return (NULL);
    }
    if (vctxt->elemInfos == NULL) {
	vctxt->elemInfos = (xmlSchemaNodeInfoPtr *)
	    xmlMalloc(10 * sizeof(xmlSchemaNodeInfoPtr));
	if (vctxt->elemInfos == NULL) {
	    xmlSchemaVErrMemory(vctxt,
		"allocating the element info array", NULL);
	    return (NULL);
	}
	memset(vctxt->elemInfos, 0, 10 * sizeof(xmlSchemaNodeInfoPtr));
	vctxt->sizeElemInfos = 10;
    } else if (vctxt->sizeElemInfos <= vctxt->depth) {
	int i = vctxt->sizeElemInfos;

	vctxt->sizeElemInfos *= 2;
	vctxt->elemInfos = (xmlSchemaNodeInfoPtr *)
	    xmlRealloc(vctxt->elemInfos, vctxt->sizeElemInfos *
	    sizeof(xmlSchemaNodeInfoPtr));
	if (vctxt->elemInfos == NULL) {
	    xmlSchemaVErrMemory(vctxt,
		"re-allocating the element info array", NULL);
	    return (NULL);
	}
	/*
	* We need the new memory to be NULLed.
	* TODO: Use memset instead?
	*/
	for (; i < vctxt->sizeElemInfos; i++)
	    vctxt->elemInfos[i] = NULL;
    } else
	info = vctxt->elemInfos[vctxt->depth];

    if (info == NULL) {
	info = (xmlSchemaNodeInfoPtr)
	    xmlMalloc(sizeof(xmlSchemaNodeInfo));
	if (info == NULL) {
	    xmlSchemaVErrMemory(vctxt,
		"allocating an element info", NULL);
	    return (NULL);
	}
	vctxt->elemInfos[vctxt->depth] = info;
    } else {
	if (info->localName != NULL) {
	    VERROR_INT("xmlSchemaGetFreshElemInfo",
		"elem info has not been cleared");
	    return (NULL);
	}
    }
    memset(info, 0, sizeof(xmlSchemaNodeInfo));
    info->nodeType = XML_ELEMENT_NODE;
    info->depth = vctxt->depth;

    return (info);
}